

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

exception<kratos::StmtException> *
pybind11::detail::register_exception_impl<kratos::StmtException>
          (handle scope,char *name,handle base,bool isLocal)

{
  bool bVar1;
  code *pcVar2;
  _lambda_std____exception_ptr__exception_ptr__1_ local_59;
  _func_void_exception_ptr *local_58;
  code *local_50;
  _func_void_ExceptionTranslator_ptr *register_func;
  PyObject *local_40;
  exception<kratos::StmtException> local_38;
  handle *local_30;
  exception<kratos::StmtException> *ex;
  char *pcStack_20;
  bool isLocal_local;
  char *name_local;
  handle base_local;
  handle scope_local;
  
  ex._7_1_ = isLocal;
  pcStack_20 = name;
  name_local = (char *)base.m_ptr;
  base_local = scope;
  local_30 = (handle *)get_exception_object<kratos::StmtException>();
  bVar1 = pybind11::handle::operator_cast_to_bool(local_30);
  if (!bVar1) {
    local_40 = base_local.m_ptr;
    register_func = (_func_void_ExceptionTranslator_ptr *)name_local;
    exception<kratos::StmtException>::exception(&local_38,base_local,pcStack_20,(handle)name_local);
    exception<kratos::StmtException>::operator=
              ((exception<kratos::StmtException> *)local_30,&local_38);
    exception<kratos::StmtException>::~exception(&local_38);
  }
  pcVar2 = register_exception_translator;
  if ((ex._7_1_ & 1) != 0) {
    pcVar2 = register_local_exception_translator;
  }
  local_50 = pcVar2;
  local_58 = register_exception_impl(pybind11::handle,char_const*,pybind11::handle,bool)::
             {lambda(std::__exception_ptr::exception_ptr)#1}::operator_cast_to_function_pointer
                       (&local_59);
  (*pcVar2)(&local_58);
  return (exception<kratos::StmtException> *)local_30;
}

Assistant:

exception<CppException> &register_exception_impl(handle scope,
                                                const char *name,
                                                handle base,
                                                bool isLocal) {
    auto &ex = detail::get_exception_object<CppException>();
    if (!ex) ex = exception<CppException>(scope, name, base);

    auto register_func = isLocal ? &register_local_exception_translator
                                 : &register_exception_translator;

    register_func([](std::exception_ptr p) {
        if (!p) return;
        try {
            std::rethrow_exception(p);
        } catch (const CppException &e) {
            detail::get_exception_object<CppException>()(e.what());
        }
    });
    return ex;
}